

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkDeviceUtil.cpp
# Opt level: O2

Move<vk::VkInstance_s_*> *
vk::createDefaultInstance
          (Move<vk::VkInstance_s_*> *__return_storage_ptr__,PlatformInterface *vkPlatform,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *enabledLayers,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *enabledExtensions,VkAllocationCallbacks *pAllocator)

{
  pointer pbVar1;
  deUint32 dVar2;
  pointer ppcVar3;
  long lVar4;
  ulong uVar5;
  vector<const_char_*,_std::allocator<const_char_*>_> extensionNamePtrs;
  vector<const_char_*,_std::allocator<const_char_*>_> layerNamePtrs;
  VkInstanceCreateInfo instanceInfo;
  VkApplicationInfo appInfo;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_d0;
  _Vector_base<const_char_*,_std::allocator<const_char_*>_> local_b8;
  VkInstanceCreateInfo local_a0;
  VkApplicationInfo local_60;
  
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_b8,
             (long)(enabledLayers->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(enabledLayers->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_a0);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)&local_d0,
             (long)(enabledExtensions->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_finish -
             (long)(enabledExtensions->
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start >> 5,(allocator_type *)&local_a0);
  local_a0.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_a0._4_4_ = 0;
  local_a0.pNext = (void *)((ulong)local_a0.pNext._4_4_ << 0x20);
  dVar2 = pack((ApiVersion *)&local_a0);
  local_60.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  local_60.pNext = (void *)0x0;
  local_60.pApplicationName = "deqp";
  local_60.applicationVersion = qpGetReleaseId();
  local_60.pEngineName = "deqp";
  local_60.engineVersion = qpGetReleaseId();
  local_a0.pApplicationInfo = &local_60;
  local_a0.sType = VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO;
  local_a0.pNext = (void *)0x0;
  local_a0.flags = 0;
  ppcVar3 = (pointer)0x0;
  local_a0.ppEnabledLayerNames = local_b8._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
      (long)local_b8._M_impl.super__Vector_impl_data._M_start == 0) {
    local_a0.ppEnabledLayerNames = ppcVar3;
  }
  local_a0.enabledLayerCount =
       (deUint32)
       ((ulong)((long)local_b8._M_impl.super__Vector_impl_data._M_finish -
               (long)local_b8._M_impl.super__Vector_impl_data._M_start) >> 3);
  local_a0.ppEnabledExtensionNames = local_d0._M_impl.super__Vector_impl_data._M_start;
  if ((long)local_d0._M_impl.super__Vector_impl_data._M_finish -
      (long)local_d0._M_impl.super__Vector_impl_data._M_start == 0) {
    local_a0.ppEnabledExtensionNames = ppcVar3;
  }
  local_a0.enabledExtensionCount =
       (deUint32)
       ((ulong)((long)local_d0._M_impl.super__Vector_impl_data._M_finish -
               (long)local_d0._M_impl.super__Vector_impl_data._M_start) >> 3);
  for (uVar5 = 0;
      pbVar1 = (enabledLayers->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(enabledLayers->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)local_b8._M_impl.super__Vector_impl_data._M_start + (long)ppcVar3) =
         *(undefined8 *)((long)&(pbVar1->_M_dataplus)._M_p + (long)ppcVar3 * 4);
    ppcVar3 = ppcVar3 + 1;
  }
  lVar4 = 0;
  for (uVar5 = 0;
      pbVar1 = (enabledExtensions->
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(enabledExtensions->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar1 >> 5);
      uVar5 = uVar5 + 1) {
    *(undefined8 *)((long)local_d0._M_impl.super__Vector_impl_data._M_start + lVar4) =
         *(undefined8 *)((long)&(pbVar1->_M_dataplus)._M_p + lVar4 * 4);
    lVar4 = lVar4 + 8;
  }
  local_60.apiVersion = dVar2;
  createInstance(__return_storage_ptr__,vkPlatform,&local_a0,pAllocator);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_d0);
  std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base(&local_b8);
  return __return_storage_ptr__;
}

Assistant:

Move<VkInstance> createDefaultInstance (const PlatformInterface&		vkPlatform,
										const vector<string>&			enabledLayers,
										const vector<string>&			enabledExtensions,
										const VkAllocationCallbacks*	pAllocator)
{
	vector<const char*>		layerNamePtrs		(enabledLayers.size());
	vector<const char*>		extensionNamePtrs	(enabledExtensions.size());
	const deUint32			apiVersion			= pack(ApiVersion(1, 0, 0));

	const struct VkApplicationInfo		appInfo			=
	{
		VK_STRUCTURE_TYPE_APPLICATION_INFO,
		DE_NULL,
		"deqp",									// pAppName
		qpGetReleaseId(),						// appVersion
		"deqp",									// pEngineName
		qpGetReleaseId(),						// engineVersion
		apiVersion								// apiVersion
	};
	const struct VkInstanceCreateInfo	instanceInfo	=
	{
		VK_STRUCTURE_TYPE_INSTANCE_CREATE_INFO,
		DE_NULL,
		(VkInstanceCreateFlags)0,
		&appInfo,
		(deUint32)layerNamePtrs.size(),
		layerNamePtrs.empty() ? DE_NULL : &layerNamePtrs[0],
		(deUint32)extensionNamePtrs.size(),
		extensionNamePtrs.empty() ? DE_NULL : &extensionNamePtrs[0],
	};

	for (size_t ndx = 0; ndx < enabledLayers.size(); ++ndx)
		layerNamePtrs[ndx] = enabledLayers[ndx].c_str();

	for (size_t ndx = 0; ndx < enabledExtensions.size(); ++ndx)
		extensionNamePtrs[ndx] = enabledExtensions[ndx].c_str();

	return createInstance(vkPlatform, &instanceInfo, pAllocator);
}